

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_POINT10_v1::LASreadItemCompressed_POINT10_v1
          (LASreadItemCompressed_POINT10_v1 *this,ArithmeticDecoder *dec)

{
  IntegerCompressor *pIVar1;
  ArithmeticModel *pAVar2;
  I32 *local_60;
  I32 *local_50;
  U8 *local_38;
  uint local_1c;
  U32 i;
  ArithmeticDecoder *dec_local;
  LASreadItemCompressed_POINT10_v1 *this_local;
  
  LASreadItemCompressed::LASreadItemCompressed(&this->super_LASreadItemCompressed);
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001afee0;
  this->last_item[0] = '\0';
  local_38 = this->last_item + 1;
  do {
    *local_38 = '\0';
    local_38 = local_38 + 1;
  } while ((I32 *)local_38 != this->last_x_diff);
  this->last_x_diff[0] = 0;
  local_50 = this->last_x_diff + 1;
  do {
    *local_50 = 0;
    local_50 = local_50 + 1;
  } while (local_50 != this->last_y_diff);
  this->last_y_diff[0] = 0;
  local_60 = this->last_y_diff + 1;
  do {
    *local_60 = 0;
    local_60 = local_60 + 1;
  } while (local_60 != &this->last_incr);
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    this->last_incr = 0;
    pIVar1 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar1,dec,0x20,1,8,0);
    this->ic_dx = pIVar1;
    pIVar1 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar1,dec,0x20,0x14,8,0);
    this->ic_dy = pIVar1;
    pIVar1 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar1,dec,0x20,0x14,8,0);
    this->ic_z = pIVar1;
    pIVar1 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar1,dec,0x10,1,8,0);
    this->ic_intensity = pIVar1;
    pIVar1 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar1,dec,8,2,8,0);
    this->ic_scan_angle_rank = pIVar1;
    pIVar1 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar1,dec,0x10,1,8,0);
    this->ic_point_source_ID = pIVar1;
    pAVar2 = ArithmeticDecoder::createSymbolModel(dec,0x40);
    this->m_changed_values = pAVar2;
    for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
      this->m_bit_byte[local_1c] = (ArithmeticModel *)0x0;
      this->m_classification[local_1c] = (ArithmeticModel *)0x0;
      this->m_user_data[local_1c] = (ArithmeticModel *)0x0;
    }
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v1.cpp"
                ,0x41,
                "LASreadItemCompressed_POINT10_v1::LASreadItemCompressed_POINT10_v1(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_POINT10_v1::LASreadItemCompressed_POINT10_v1(ArithmeticDecoder* dec)
{
  U32 i;

  /* set decoder */
  assert(dec);
  this->dec = dec;

  last_incr = 0;

  /* create models and integer compressors */
  ic_dx = new IntegerCompressor(dec, 32);  // 32 bits, 1 context
  ic_dy = new IntegerCompressor(dec, 32, 20); // 32 bits, 20 contexts
  ic_z = new IntegerCompressor(dec, 32, 20);  // 32 bits, 20 contexts
  ic_intensity = new IntegerCompressor(dec, 16);
  ic_scan_angle_rank = new IntegerCompressor(dec, 8, 2);
  ic_point_source_ID = new IntegerCompressor(dec, 16);
  m_changed_values = dec->createSymbolModel(64);
  for (i = 0; i < 256; i++)
  {
    m_bit_byte[i] = 0;
    m_classification[i] = 0;
    m_user_data[i] = 0;
  }
}